

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O3

btVector3 operator*(btMatrix3x3 *m,btVector3 *v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  btVector3 bVar4;
  
  fVar1 = v->m_floats[0];
  fVar2 = v->m_floats[1];
  fVar3 = v->m_floats[2];
  bVar4.m_floats[0] =
       m->m_el[0].m_floats[2] * fVar3 +
       m->m_el[0].m_floats[0] * fVar1 + m->m_el[0].m_floats[1] * fVar2;
  bVar4.m_floats[1] =
       fVar3 * m->m_el[1].m_floats[2] +
       fVar1 * m->m_el[1].m_floats[0] + m->m_el[1].m_floats[1] * fVar2;
  bVar4.m_floats[2] =
       fVar3 * m->m_el[2].m_floats[2] +
       fVar1 * m->m_el[2].m_floats[0] + m->m_el[2].m_floats[1] * fVar2;
  bVar4.m_floats[3] = 0.0;
  return (btVector3)bVar4.m_floats;
}

Assistant:

SIMD_FORCE_INLINE btScalar dot(const btVector3& v) const
	{
#if defined BT_USE_SIMD_VECTOR3 && defined (BT_USE_SSE_IN_API) && defined (BT_USE_SSE)
		__m128 vd = _mm_mul_ps(mVec128, v.mVec128);
		__m128 z = _mm_movehl_ps(vd, vd);
		__m128 y = _mm_shuffle_ps(vd, vd, 0x55);
		vd = _mm_add_ss(vd, y);
		vd = _mm_add_ss(vd, z);
		return _mm_cvtss_f32(vd);
#elif defined(BT_USE_NEON)
		float32x4_t vd = vmulq_f32(mVec128, v.mVec128);
		float32x2_t x = vpadd_f32(vget_low_f32(vd), vget_low_f32(vd));
		x = vadd_f32(x, vget_high_f32(vd));
		return vget_lane_f32(x, 0);
#else
		return	m_floats[0] * v.m_floats[0] +
				m_floats[1] * v.m_floats[1] +
				m_floats[2] * v.m_floats[2];
#endif
	}